

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O3

shared_ptr<binlog::Session::Channel> __thiscall
binlog::Session::createChannel(Session *this,size_t queueCapacity,WriterProp *writerProp)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  WriterProp *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<binlog::Session::Channel> sVar4;
  undefined1 local_31;
  shared_ptr<binlog::Session::Channel> local_30;
  WriterProp *local_20;
  
  local_20 = writerProp;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)queueCapacity);
  if (iVar2 == 0) {
    local_30.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<binlog::Session::Channel,std::allocator<binlog::Session::Channel>,binlog::Session&,unsigned_long&,binlog::WriterProp>
              (&local_30.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Channel **)&local_30,(allocator<binlog::Session::Channel> *)&local_31,
               (Session *)queueCapacity,(unsigned_long *)&local_20,in_RCX);
    std::
    vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>
    ::emplace_back<std::shared_ptr<binlog::Session::Channel>>
              ((vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>
                *)(queueCapacity + 0x28),&local_30);
    if (local_30.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar1 = *(long *)(queueCapacity + 0x30);
    (this->_mutex).super___mutex_base._M_mutex.__align = *(long *)(lVar1 + -0x10);
    lVar1 = *(long *)(lVar1 + -8);
    *(long *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = lVar1;
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)queueCapacity);
    sVar4.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    sVar4.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<binlog::Session::Channel>)
           sVar4.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar3 = std::__throw_system_error(iVar2);
  if (local_30.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)queueCapacity);
  _Unwind_Resume(uVar3);
}

Assistant:

inline std::shared_ptr<Session::Channel> Session::createChannel(std::size_t queueCapacity, WriterProp writerProp)
{
  std::lock_guard<std::mutex> lock(_mutex);

  _channels.push_back(std::make_shared<Channel>(*this, queueCapacity, std::move(writerProp)));
  return _channels.back();
}